

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerGLSL::convert_float_to_string_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,SPIRConstant *c,uint32_t col,
          uint32_t row)

{
  float t;
  bool bVar1;
  CompilerError *this_00;
  char (*in_stack_fffffffffffffcb0) [5];
  char *comment;
  spirv_cross local_338 [32];
  char print_buffer [32];
  string local_2f0;
  undefined1 local_2d0 [192];
  uint *local_210;
  size_t local_208;
  size_t local_200;
  uint local_1f8 [8];
  TypeID local_1d8;
  undefined8 local_1c0;
  __node_base_ptr *local_1b8;
  size_type local_1b0;
  __node_base local_1a8;
  size_type sStack_1a0;
  float local_198;
  size_t local_190;
  __node_base_ptr p_Stack_188;
  undefined1 local_180 [192];
  uint *local_c0;
  size_t local_b8;
  size_t local_b0;
  uint auStack_a8 [8];
  TypeID local_88;
  undefined8 local_70;
  __node_base_ptr *local_68;
  size_type local_60;
  __node_base local_58;
  size_type sStack_50;
  float local_48;
  size_t local_40;
  __node_base_ptr p_Stack_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  t = (c->m).c[col].r[row].f32;
  if (NAN(t) || ABS(t) == INFINITY) {
    bVar1 = is_legacy(this);
    if (bVar1) {
      if (((t < INFINITY) && (-INFINITY < t)) && (!NAN(t))) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)local_2d0,"Cannot represent non-finite floating point constant.",
                   (allocator *)local_180);
        CompilerError::CompilerError(this_00,(string *)local_2d0);
        __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      ::std::__cxx11::string::assign((char *)__return_storage_ptr__);
    }
    else {
      local_2d0._32_8_ = local_2d0 + 0x38;
      local_2d0._8_4_ = 0;
      local_2d0._0_8_ = &PTR__SPIRType_0043c280;
      local_2d0._20_4_ = 1;
      local_2d0._40_8_ = 0;
      local_2d0._48_8_ = 8;
      local_2d0._88_8_ = local_2d0 + 0x70;
      local_2d0._96_8_ = 0;
      local_2d0._104_8_ = 8;
      local_2d0._120_4_ = 0;
      local_2d0[0x7c] = false;
      local_2d0[0x7d] = false;
      local_2d0._128_4_ = StorageClassGeneric;
      local_2d0._136_8_ = local_2d0 + 0xa0;
      local_2d0._144_8_ = 0;
      local_2d0._152_8_ = 8;
      local_210 = local_1f8;
      local_208 = 0;
      local_200 = 8;
      local_1d8.id = 0;
      local_1c0._0_4_ = 0;
      local_1c0._4_4_ = 0;
      local_1b8 = &p_Stack_188;
      local_1b0 = 1;
      local_1a8._M_nxt = (_Hash_node_base *)0x0;
      sStack_1a0 = 0;
      local_198 = 1.0;
      local_180._32_8_ = local_180 + 0x38;
      local_180._8_4_ = 0;
      local_180._0_8_ = &PTR__SPIRType_0043c280;
      local_180._40_8_ = 0;
      local_190 = 0;
      p_Stack_188 = (__node_base_ptr)0x0;
      local_180._48_8_ = 8;
      local_180._88_8_ = local_180 + 0x70;
      local_180._96_8_ = 0;
      local_180._104_8_ = 8;
      local_180._120_4_ = 0;
      local_180[0x7c] = false;
      local_180[0x7d] = false;
      local_180._144_8_ = 0;
      local_180._136_8_ = local_180 + 0xa0;
      local_180._152_8_ = 8;
      local_c0 = auStack_a8;
      local_b8 = 0;
      local_b0 = 8;
      local_88.id = 0;
      local_70._0_4_ = 0;
      local_70._4_4_ = 0;
      local_68 = &p_Stack_38;
      local_60 = 1;
      local_58._M_nxt = (_Hash_node_base *)0x0;
      sStack_50 = 0;
      local_48 = 1.0;
      local_40 = 0;
      p_Stack_38 = (__node_base_ptr)0x0;
      local_2d0._12_8_ = 0x200000000d;
      local_180._16_4_ = 0x20;
      local_180._20_4_ = 1;
      local_2d0._24_4_ = local_2d0._20_4_;
      local_180._12_4_ = local_2d0._128_4_;
      local_180._24_4_ = local_2d0._20_4_;
      local_180._128_4_ = local_2d0._128_4_;
      snprintf(print_buffer,0x20,"0x%xu",(ulong)(c->m).c[col].r[row].u32);
      comment = "inf";
      if (-INFINITY < t) {
        if (NAN(t)) {
          comment = "nan";
        }
      }
      else {
        comment = "-inf";
      }
      (*(this->super_Compiler)._vptr_Compiler[0x38])(local_338,this,local_2d0,local_180);
      join<std::__cxx11::string,char_const(&)[2],char(&)[32],char_const(&)[5],char_const*&,char_const(&)[5]>
                (&local_2f0,local_338,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3965df,
                 (char (*) [2])print_buffer,(char (*) [32])" /* ",(char (*) [5])&comment,
                 (char **)" */)",in_stack_fffffffffffffcb0);
      ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_2f0);
      ::std::__cxx11::string::~string((string *)&local_2f0);
      ::std::__cxx11::string::~string((string *)local_338);
      SPIRType::~SPIRType((SPIRType *)local_180);
      SPIRType::~SPIRType((SPIRType *)local_2d0);
    }
  }
  else {
    convert_to_string_abi_cxx11_
              ((string *)local_2d0,
               (spirv_cross *)(ulong)(uint)(int)this->current_locale_radix_character,t,(char)c);
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_2d0);
    ::std::__cxx11::string::~string((string *)local_2d0);
    if ((this->backend).float_literal_suffix == true) {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::convert_float_to_string(const SPIRConstant &c, uint32_t col, uint32_t row)
{
	string res;
	float float_value = c.scalar_f32(col, row);

	if (std::isnan(float_value) || std::isinf(float_value))
	{
		// Use special representation.
		if (!is_legacy())
		{
			SPIRType out_type;
			SPIRType in_type;
			out_type.basetype = SPIRType::Float;
			in_type.basetype = SPIRType::UInt;
			out_type.vecsize = 1;
			in_type.vecsize = 1;
			out_type.width = 32;
			in_type.width = 32;

			char print_buffer[32];
#ifdef _WIN32
			sprintf(print_buffer, "0x%xu", c.scalar(col, row));
#else
			snprintf(print_buffer, sizeof(print_buffer), "0x%xu", c.scalar(col, row));
#endif

			const char *comment = "inf";
			if (float_value == -numeric_limits<float>::infinity())
				comment = "-inf";
			else if (std::isnan(float_value))
				comment = "nan";
			res = join(bitcast_glsl_op(out_type, in_type), "(", print_buffer, " /* ", comment, " */)");
		}
		else
		{
			if (float_value == numeric_limits<float>::infinity())
			{
				if (backend.float_literal_suffix)
					res = "(1.0f / 0.0f)";
				else
					res = "(1.0 / 0.0)";
			}
			else if (float_value == -numeric_limits<float>::infinity())
			{
				if (backend.float_literal_suffix)
					res = "(-1.0f / 0.0f)";
				else
					res = "(-1.0 / 0.0)";
			}
			else if (std::isnan(float_value))
			{
				if (backend.float_literal_suffix)
					res = "(0.0f / 0.0f)";
				else
					res = "(0.0 / 0.0)";
			}
			else
				SPIRV_CROSS_THROW("Cannot represent non-finite floating point constant.");
		}
	}
	else
	{
		res = convert_to_string(float_value, current_locale_radix_character);
		if (backend.float_literal_suffix)
			res += "f";
	}

	return res;
}